

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O3

REF_STATUS ref_list_pop(REF_LIST ref_list,REF_INT *last)

{
  int iVar1;
  long lVar2;
  REF_INT RVar3;
  
  iVar1 = ref_list->n;
  lVar2 = (long)iVar1;
  if (lVar2 == 0) {
    RVar3 = -1;
  }
  else {
    ref_list->n = iVar1 + -1;
    RVar3 = ref_list->value[lVar2 + -1];
  }
  *last = RVar3;
  return (uint)(lVar2 == 0);
}

Assistant:

REF_FCN REF_STATUS ref_list_pop(REF_LIST ref_list, REF_INT *last) {
  if (0 == ref_list_n(ref_list)) {
    *last = REF_EMPTY;
    return REF_FAILURE;
  }

  ref_list_n(ref_list)--;
  *last = ref_list->value[ref_list_n(ref_list)];

  return REF_SUCCESS;
}